

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateBufferVariableMatrixVariableCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               ProgramResourcePropFlags targetProp)

{
  TestNode *this;
  SharedPtr *context_00;
  ArrayElement *this_00;
  Variable *this_01;
  ResourceTestCase *this_02;
  ProgramResourceQueryTestTarget local_88;
  undefined1 local_80 [8];
  SharedPtr variable;
  SharedPtr unsized;
  allocator<char> local_49;
  string local_48;
  ProgramResourcePropFlags local_24;
  TestNode *pTStack_20;
  ProgramResourcePropFlags targetProp_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  local_24 = targetProp;
  pTStack_20 = &targetGroup->super_TestNode;
  targetGroup_local = (TestCaseGroup *)parentStructure;
  parentStructure_local = (SharedPtr *)context;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  generateBufferBackedVariableAggregateTypeCases
            (context,parentStructure,targetGroup,PROGRAMINTERFACE_BUFFER_VARIABLE,targetProp,
             TYPE_FLOAT_MAT3X2,&local_48,2);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  this_00 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(this_00,(SharedPtr *)targetGroup_local,-2);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&variable.m_state,(Node *)this_00);
  this_01 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(this_01,(SharedPtr *)&variable.m_state,TYPE_FLOAT_MAT3X2);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_80,(Node *)this_01);
  this = pTStack_20;
  this_02 = (ResourceTestCase *)operator_new(0xb0);
  context_00 = parentStructure_local;
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_88,PROGRAMINTERFACE_BUFFER_VARIABLE,local_24);
  ResourceTestCase::ResourceTestCase
            (this_02,(Context *)context_00,(SharedPtr *)local_80,&local_88,"var_unsized_array");
  tcu::TestNode::addChild(this,(TestNode *)this_02);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_80);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&variable.m_state);
  return;
}

Assistant:

static void generateBufferVariableMatrixVariableCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, ProgramResourcePropFlags targetProp)
{
	// Basic aggregates
	generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, targetProp, glu::TYPE_FLOAT_MAT3X2, "", 2);

	// Unsized array
	{
		const ResourceDefinition::Node::SharedPtr	unsized		(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));
		const ResourceDefinition::Node::SharedPtr	variable	(new ResourceDefinition::Variable(unsized, glu::TYPE_FLOAT_MAT3X2));

		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(PROGRAMINTERFACE_BUFFER_VARIABLE, targetProp), "var_unsized_array"));
	}
}